

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

void __thiscall CChat::AddLine(CChat *this,char *pLine,int ClientID,int Mode,int TargetID)

{
  char *buffer;
  uint uVar1;
  long lVar2;
  CGameClient *pCVar3;
  IConsole *pIVar4;
  long lVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  int64 iVar9;
  int64 iVar10;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  long in_FS_OFFSET;
  char *pStr;
  char aBuf [1024];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*pLine != '\0') && ((ClientID < 1 || (bVar6 = IsClientIgnored(this,ClientID), !bVar6)))) &&
     ((Mode != 3 ||
      (((-1 < (TargetID | ClientID) && (bVar6 = IsClientIgnored(this,TargetID), !bVar6)) &&
       (iVar13 = ((this->super_CComponent).m_pClient)->m_LocalClientID,
       iVar13 == ClientID || iVar13 == TargetID)))))) {
    iVar13 = 0x7f;
    pcVar11 = (char *)0x0;
    pStr = pLine;
    do {
      pcVar15 = pStr;
      if (*pStr == '\0') goto LAB_0012d26d;
      iVar8 = str_utf8_decode(&pStr);
      iVar8 = str_utf8_is_whitespace(iVar8);
      if (pcVar11 != (char *)0x0) {
        pcVar15 = pcVar11;
      }
      pcVar11 = (char *)0x0;
      if (iVar8 != 0) {
        pcVar11 = pcVar15;
      }
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
    *pStr = '\0';
LAB_0012d26d:
    if (pcVar11 != (char *)0x0) {
      *pcVar11 = '\0';
    }
    bVar6 = false;
    while (cVar7 = *pLine, pcVar11 = pLine, cVar7 != '\0') {
      while (pcVar15 = pcVar11 + 1, cVar7 != '\0') {
        if (cVar7 == '\n') {
          *pcVar11 = '\0';
          pcVar11 = pcVar15;
          break;
        }
        pcVar11 = pcVar15;
        cVar7 = *pcVar15;
      }
      iVar13 = (this->m_CurrentLine + 1) % 0xfa;
      this->m_CurrentLine = iVar13;
      iVar9 = time_get();
      this->m_aLines[iVar13].m_Time = iVar9;
      this->m_aLines[iVar13].m_Size.field_1.y = -1.0;
      this->m_aLines[iVar13].m_ClientID = ClientID;
      this->m_aLines[iVar13].m_TargetID = TargetID;
      this->m_aLines[iVar13].m_Mode = Mode;
      this->m_aLines[iVar13].m_NameColor = -2;
      uVar14 = ClientID;
      if (ClientID < 0 || Mode == 3) {
        bVar6 = false;
        this->m_aLines[iVar13].m_Highlighted = false;
        if (Mode == 3) {
          if (((this->super_CComponent).m_pClient)->m_LocalClientID == ClientID) {
            uVar14 = TargetID;
          }
          if (TargetID < 0) {
            uVar14 = ClientID;
          }
          bVar6 = false;
        }
      }
      else {
        pCVar3 = (this->super_CComponent).m_pClient;
        iVar8 = pCVar3->m_LocalClientID;
        if ((iVar8 == ClientID) ||
           (pcVar15 = str_find_nocase(pLine,pCVar3->m_aClients[iVar8].m_aName),
           pcVar15 == (char *)0x0)) {
          bVar6 = false;
        }
        else {
          pCVar3 = (this->super_CComponent).m_pClient;
          iVar8 = str_length(pCVar3->m_aClients[pCVar3->m_LocalClientID].m_aName);
          if ((pLine == pcVar15) || (pcVar15[-1] == ' ')) {
            bVar6 = (pcVar15[iVar8] & 0xdfU) == 0;
            if ((pcVar15[iVar8] == 0x3a) && ((pcVar15[(long)iVar8 + 1] & 0xdfU) == 0)) {
              bVar6 = true;
            }
          }
          else {
            bVar6 = false;
          }
          this->m_CompletionFav = ClientID;
        }
        this->m_aLines[iVar13].m_Highlighted = bVar6;
      }
      if (ClientID == -2) {
        this->m_aLines[iVar13].m_aName[0] = '\0';
        pcVar15 = anon_var_dwarf_46aa8;
      }
      else if (ClientID == -1) {
        this->m_aLines[iVar13].m_aName[0] = '\0';
        pcVar15 = "*** %s";
      }
      else {
        pCVar3 = (this->super_CComponent).m_pClient;
        uVar1 = pCVar3->m_aClients[ClientID].m_Team;
        if (uVar1 == 0xffffffff) {
          this->m_aLines[iVar13].m_NameColor = -1;
        }
        if (uVar1 < 2 && ((pCVar3->m_GameInfo).m_GameFlags & 1) != 0) {
          this->m_aLines[iVar13].m_NameColor = uVar1;
        }
        str_format(this->m_aLines[iVar13].m_aName,0x41,"%s",pCVar3->m_aClients + (int)uVar14);
        pcVar15 = "%s";
      }
      buffer = this->m_aLines[iVar13].m_aText;
      str_format(buffer,0x200,pcVar15,pLine);
      str_format(aBuf,0x400,"%2d: %s: %s",(ulong)uVar14,this->m_aLines[iVar13].m_aName,buffer);
      pIVar4 = ((this->super_CComponent).m_pClient)->m_pConsole;
      pcVar15 = "";
      if (Mode - 1U < 3) {
        pcVar15 = *(char **)(&DAT_00206c20 + (ulong)(Mode - 1U) * 8);
      }
      (*(pIVar4->super_IInterface)._vptr_IInterface[0x19])
                (pIVar4,0,pcVar15,aBuf,(ulong)(byte)(Mode == 3 | bVar6));
      pLine = pcVar11;
    }
    pCVar3 = (this->super_CComponent).m_pClient;
    if ((Mode == 3) && (pCVar3->m_LocalClientID != ClientID)) {
      this->m_LastWhisperFrom = ClientID;
    }
    if (pCVar3->m_pConfig->m_ClShowChat != 0) {
      uVar12 = 0;
      if (-1 < ClientID) {
        uVar12 = (ulong)(2 - (byte)(Mode == 3 | bVar6));
      }
      iVar9 = time_get();
      lVar5 = this->m_aLastSoundPlayed[uVar12];
      iVar10 = time_freq();
      if ((float)iVar10 * 0.3 <= (float)(iVar9 - lVar5)) {
        CSounds::Play(((this->super_CComponent).m_pClient)->m_pSounds,0,
                      *(int *)(&DAT_001c914c + uVar12 * 4),0.0);
        this->m_aLastSoundPlayed[uVar12] = iVar9;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CChat::AddLine(const char *pLine, int ClientID, int Mode, int TargetID)
{
	if(*pLine == 0 || (ClientID > 0 && IsClientIgnored(ClientID)))
		return;

	if(Mode == CHAT_WHISPER)
	{
		if(ClientID < 0 || TargetID < 0 || IsClientIgnored(TargetID))
			return;
		// should be sender or receiver
		if(ClientID != m_pClient->m_LocalClientID && TargetID != m_pClient->m_LocalClientID)
			return;
	}

	// trim right and set maximum length to 128 utf8-characters
	int Length = 0;
	const char *pStr = pLine;
	const char *pEnd = 0;
	while(*pStr)
	{
		const char *pStrOld = pStr;
		int Code = str_utf8_decode(&pStr);

		// check if unicode is not empty
		if(!str_utf8_is_whitespace(Code))
		{
			pEnd = 0;
		}
		else if(pEnd == 0)
			pEnd = pStrOld;

		if(++Length >= 127)
		{
			*(const_cast<char *>(pStr)) = 0;
			break;
		}
	}
	if(pEnd != 0)
		*(const_cast<char *>(pEnd)) = 0;

	bool Highlighted = false;
	char *p = const_cast<char*>(pLine);
	while(*p)
	{
		pLine = p;
		// find line separator and strip multiline
		while(*p)
		{
			if(*p++ == '\n')
			{
				*(p-1) = 0;
				break;
			}
		}

		m_CurrentLine = (m_CurrentLine+1)%MAX_LINES;
		CLine *pCurLine = &m_aLines[m_CurrentLine];

		pCurLine->m_Time = time_get();
		pCurLine->m_Size.y = -1.0f;
		pCurLine->m_ClientID = ClientID;
		pCurLine->m_TargetID = TargetID;
		pCurLine->m_Mode = Mode;
		pCurLine->m_NameColor = -2;

		// check for highlighted name
		Highlighted = false;
		// do not highlight our own messages, whispers and system messages
		if(Mode != CHAT_WHISPER && ClientID >= 0 && ClientID != m_pClient->m_LocalClientID)
		{
			const char *pHL = str_find_nocase(pLine, m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
			if(pHL)
			{
				int Length = str_length(m_pClient->m_aClients[m_pClient->m_LocalClientID].m_aName);
				if((pLine == pHL || pHL[-1] == ' ')) // "" or " " before
				{
					if((pHL[Length] == 0 || pHL[Length] == ' ')) // "" or " " after
						Highlighted = true;
					if(pHL[Length] == ':' && (pHL[Length+1] == 0 || pHL[Length+1] == ' ')) // ":" or ": " after
						Highlighted = true;
				}
				m_CompletionFav = ClientID;
			}
		}

		pCurLine->m_Highlighted =  Highlighted;

		int NameCID = ClientID;
		if(Mode == CHAT_WHISPER && ClientID == m_pClient->m_LocalClientID && TargetID >= 0)
			NameCID = TargetID;

		if(ClientID == SERVER_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "*** %s", pLine);
		}
		else if(ClientID == CLIENT_MSG)
		{
			pCurLine->m_aName[0] = '\0';
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "— %s", pLine);
		}
		else
		{
			if(m_pClient->m_aClients[ClientID].m_Team == TEAM_SPECTATORS)
				pCurLine->m_NameColor = TEAM_SPECTATORS;

			if(m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS)
			{
				if(m_pClient->m_aClients[ClientID].m_Team == TEAM_RED)
					pCurLine->m_NameColor = TEAM_RED;
				else if(m_pClient->m_aClients[ClientID].m_Team == TEAM_BLUE)
					pCurLine->m_NameColor = TEAM_BLUE;
			}

			str_format(pCurLine->m_aName, sizeof(pCurLine->m_aName), "%s", m_pClient->m_aClients[NameCID].m_aName);
			str_format(pCurLine->m_aText, sizeof(pCurLine->m_aText), "%s", pLine);
		}

		char aBuf[1024];
		str_format(aBuf, sizeof(aBuf), "%2d: %s: %s", NameCID, pCurLine->m_aName, pCurLine->m_aText);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, GetModeName(Mode), aBuf, Highlighted || Mode == CHAT_WHISPER);
	}

	if(Mode == CHAT_WHISPER && m_pClient->m_LocalClientID != ClientID)
		m_LastWhisperFrom = ClientID; // we received a whisper

	// play sound
	if(Config()->m_ClShowChat)
	{
		int ChatType;
		if(ClientID < 0)
			ChatType = CHAT_SERVER;
		else if(Highlighted || Mode == CHAT_WHISPER)
			ChatType = CHAT_HIGHLIGHT;
		else
			ChatType = CHAT_CLIENT;

		const int64 Now = time_get();
		if(Now - m_aLastSoundPlayed[ChatType] >= time_freq() * 0.3f)
		{
			m_pClient->m_pSounds->Play(CSounds::CHN_GUI, GetChatSound(ChatType), 0);
			m_aLastSoundPlayed[ChatType] = Now;
		}
	}
}